

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<float>_>_>::TPZVec
          (TPZVec<TPZAutoPointer<TPZFMatrix<float>_>_> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  TPZAutoPointer<TPZFMatrix<float>_> *pTVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  TPZAutoPointer<TPZFMatrix<float>_> *local_50;
  
  *in_RDI = &PTR__TPZVec_023e72e0;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<TPZAutoPointer<TPZFMatrix<float>>>::TPZVec(const int64_t) [T = TPZAutoPointer<TPZFMatrix<float>>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (0 < (long)in_RSI) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      uVar5 = uVar2 + 8;
      if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar2) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar3 = (ulong *)operator_new__(uVar5);
      *puVar3 = in_RSI;
      pTVar4 = (TPZAutoPointer<TPZFMatrix<float>_> *)(puVar3 + 1);
      if (in_RSI != 0) {
        local_50 = pTVar4;
        do {
          TPZAutoPointer<TPZFMatrix<float>_>::TPZAutoPointer(local_50);
          local_50 = local_50 + 1;
        } while (local_50 != pTVar4 + in_RSI);
      }
      in_RDI[1] = pTVar4;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}